

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# State.cpp
# Opt level: O2

bool __thiscall State::isFinished(State *this)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar1 = this->height;
  uVar2 = this->width;
  uVar3 = 0;
  uVar6 = 0;
  if (0 < (int)uVar2) {
    uVar6 = (ulong)uVar2;
  }
  uVar7 = 0;
  if (0 < (int)uVar1) {
    uVar7 = (ulong)uVar1;
  }
  iVar5 = 1;
  for (; uVar3 != uVar7; uVar3 = uVar3 + 1) {
    for (uVar4 = 0; uVar6 != uVar4; uVar4 = uVar4 + 1) {
      if ((iVar5 - this->size) + (int)uVar4 == 0) {
        if (this->tiles[uVar3][uVar4] != 0) goto LAB_00104371;
      }
      else if (iVar5 + (int)uVar4 != this->tiles[uVar3][uVar4]) goto LAB_00104371;
    }
    iVar5 = iVar5 + uVar2;
  }
LAB_00104371:
  return (long)(int)uVar1 <= (long)uVar3;
}

Assistant:

bool State::isFinished() {
    for (int i = 0; i < height; i++) {
        for (int j = 0; j < width; j++) {
            int expected = 1 + i * width + j;
            int actual = tiles[i][j];

            if (expected == size) {
                if (actual != 0) {
                    return false;
                }
            } else {
                if (actual != expected) {
                    return false;
                }
            }
        }
    }
    return true;
}